

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEq2deg.cpp
# Opt level: O0

void __thiscall master_test_suite::eq2deg1::test_method(eq2deg1 *this)

{
  double dVar1;
  __type _Var2;
  unit_test_log_t *puVar3;
  bool bVar4;
  log_level lVar5;
  lazy_ostream *plVar6;
  Eq2deg *this_00;
  ostream *this_01;
  void *this_02;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]> local_1d0;
  undefined4 local_1ac;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[35],_const_char_(&)[35]> local_160;
  undefined4 local_13c;
  assertion_result local_138;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[29],_const_char_(&)[29]> local_f0;
  assertion_result local_d0;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8;
  double local_98;
  double delta;
  double local_88;
  double local_80;
  Eq2deg *local_78;
  Eq2deg *eq1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> local_60;
  basic_cstring<const_char> local_40;
  begin local_30;
  unit_test_log_t local_11;
  eq2deg1 *local_10;
  eq2deg1 *this_local;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = this;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
             ,0x6f);
  boost::unit_test::log::begin::begin(&local_30,&local_40,0x39);
  lVar5 = boost::unit_test::unit_test_log_t::operator<<(puVar3,&local_30);
  boost::unit_test::unit_test_log_t::operator()(&local_11,lVar5);
  plVar6 = boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<(&local_60,plVar6,(char (*) [16])"Testing x^2-x-1");
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_11,&local_60.super_lazy_ostream);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl(&local_60);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_11);
  this_00 = (Eq2deg *)operator_new(0x40);
  local_80 = 1.0;
  local_88 = -1.0;
  delta = -1.0;
  Eq2deg::Eq2deg(this_00,&local_80,&local_88,&delta);
  local_78 = this_00;
  if (this_00 == (Eq2deg *)0x0) {
    __assert_fail("eq1 != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
                  ,0x3b,"void master_test_suite::eq2deg1::test_method()");
  }
  (**(code **)(*(long *)this_00 + 0x18))();
  local_98 = (double)(**(code **)(*(long *)local_78 + 0x28))();
  (**(code **)(*(long *)local_78 + 0x20))();
  this_01 = std::operator<<((ostream *)&std::cout,"Discriminant: ");
  this_02 = (void *)std::ostream::operator<<(this_01,local_98);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_a8,0x41,&local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_d0,(bool)(-(local_98 == 5.0) & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f0,plVar6,(char (*) [29])"The discriminant should be 5");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::test_tools::tt_detail::report_assertion(&local_d0,&local_f0,&local_100,0x41,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[29],_const_char_(&)[29]>::
    ~lazy_ostream_impl(&local_f0);
    boost::test_tools::assertion_result::~assertion_result(&local_d0);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_110,0x44,&local_120);
    local_13c = 1;
    dVar1 = (double)Eq2deg::getRoot((int *)local_78);
    _Var2 = std::sqrt<int>(5);
    boost::test_tools::assertion_result::assertion_result
              (&local_138,(bool)(-(dVar1 == (1.0 - _Var2) * 0.5) & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_160,plVar6,(char (*) [35])"The first root should be -0.618034");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::test_tools::tt_detail::report_assertion(&local_138,&local_160,&local_170,0x44,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[35],_const_char_(&)[35]>::
    ~lazy_ostream_impl(&local_160);
    boost::test_tools::assertion_result::~assertion_result(&local_138);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_180,0x47,&local_190);
    local_1ac = 2;
    dVar1 = (double)Eq2deg::getRoot((int *)local_78);
    _Var2 = std::sqrt<int>(5);
    boost::test_tools::assertion_result::assertion_result
              (&local_1a8,(bool)(-(dVar1 == (_Var2 + 1.0) * 0.5) & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_1d0,plVar6,(char (*) [34])"The second root should be 1.61803");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
               ,0x6f);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_1d0,&local_1e0,0x47,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>::
    ~lazy_ostream_impl(&local_1d0);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  if (local_78 != (Eq2deg *)0x0) {
    (**(code **)(*(long *)local_78 + 0x10))();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE (eq2deg1) {
  BOOST_TEST_MESSAGE("Testing x^2-x-1");
  Eq2deg* eq1 = new Eq2deg (1, -1, -1);
  assert (eq1 != nullptr);
  eq1->computeDelta();
  double delta = eq1->getDelta();
  eq1->computeRoots();
  std::cout << "Discriminant: " << delta << std::endl;
  BOOST_CHECK_MESSAGE (delta == 5,
                       "The discriminant should be 5");

  BOOST_CHECK_MESSAGE (eq1->getRoot(1) == (1-sqrt(5))/2,
                       "The first root should be -0.618034");

  BOOST_CHECK_MESSAGE (eq1->getRoot(2) == (1+sqrt(5))/2,
                       "The second root should be 1.61803");

  // Cleaning
  delete eq1; eq1 = nullptr;
}